

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

string * __thiscall
helics::Federate::localNameGenerator_abi_cxx11_(Federate *this,string_view addition)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  Federate *in_RSI;
  string *in_RDI;
  string *localName;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  }
  else {
    getName_abi_cxx11_(in_RSI);
    std::__cxx11::string::string(in_RCX,in_RDX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               (char)((ulong)in_RDI >> 0x38));
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

std::string Federate::localNameGenerator(std::string_view addition) const
{
    if (!addition.empty()) {
        std::string localName = getName();
        localName.push_back(nameSegmentSeparator);
        localName.append(addition);
        return localName;
    }
    return std::string{};
}